

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_mem_constraint.c
# Opt level: O2

constraint_handler_t set_mem_constraint_handler_s(constraint_handler_t handler)

{
  constraint_handler_t p_Var1;
  long in_FS_OFFSET;
  
  if (handler == (constraint_handler_t)0x0) {
    handler = ignore_handler_s;
  }
  p_Var1 = mem_handler;
  mem_handler = handler;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

constraint_handler_t
set_mem_constraint_handler_s (constraint_handler_t handler)
{
    constraint_handler_t prev_handler = mem_handler;
    if (NULL == handler) {
        mem_handler = sl_default_handler;
    } else {
        mem_handler = handler;
    }
    return prev_handler;
}